

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O3

string * __thiscall
chrono::ChClassFactory::_GetClassTagName_abi_cxx11_(ChClassFactory *this,type_info *mtype)

{
  iterator iVar1;
  string *psVar2;
  ChException *this_00;
  string local_48;
  key_type local_28;
  
  local_28._M_target = mtype;
  iVar1 = std::
          _Hashtable<std::type_index,_std::pair<const_std::type_index,_chrono::ChClassRegistrationBase_*>,_std::allocator<std::pair<const_std::type_index,_chrono::ChClassRegistrationBase_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_chrono::ChClassRegistrationBase_*>,_std::allocator<std::pair<const_std::type_index,_chrono::ChClassRegistrationBase_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(this + 0x38),&local_28);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::type_index,_chrono::ChClassRegistrationBase_*>,_false>
      ._M_cur != (__node_type *)0x0) {
    psVar2 = (string *)
             (**(code **)(**(long **)((long)iVar1.
                                            super__Node_iterator_base<std::pair<const_std::type_index,_chrono::ChClassRegistrationBase_*>,_false>
                                            ._M_cur + 0x10) + 0x18))();
    return psVar2;
  }
  this_00 = (ChException *)__cxa_allocate_exception(0x28);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "ChClassFactory::GetClassTagName() cannot find the class. Please register it.\n","");
  ChException::ChException(this_00,&local_48);
  __cxa_throw(this_00,&ChException::typeinfo,ChException::~ChException);
}

Assistant:

std::string& _GetClassTagName(const std::type_info& mtype) {
        const auto &it = class_map_typeids.find(std::type_index(mtype));
        if (it != class_map_typeids.end()) {
            return it->second->get_tag_name();
        }
        throw ( ChException("ChClassFactory::GetClassTagName() cannot find the class. Please register it.\n") );
    }